

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_string_codePointAt(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue JVar1;
  JSValue JVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int64_t iVar6;
  JSValue v;
  JSValue v_00;
  JSValue JVar7;
  int idx;
  int local_2c;
  JSValueUnion local_28;
  
  JVar7 = JS_ToStringCheckObject(ctx,this_val);
  v.tag = JVar7.tag;
  JVar7.u = JVar7.u;
  uVar5 = (uint)JVar7.tag;
  if (uVar5 != 6) {
    JVar7 = *argv;
    if (0xfffffff4 < (uint)argv->tag) {
      *(int *)(argv->u).ptr = *(argv->u).ptr + 1;
    }
    local_28 = JVar7.u;
    iVar3 = JS_ToInt32SatFree(ctx,&local_2c,JVar7);
    if (iVar3 == 0) {
      iVar6 = 3;
      if ((local_2c < 0) || ((int)(*(uint *)((long)JVar7.u.ptr + 4) & 0x7fffffff) <= local_2c)) {
        JVar7.u.float64 = 0.0;
      }
      else {
        uVar4 = string_getc((JSString *)JVar7.u.ptr,&local_2c);
        JVar7.u._4_4_ = 0;
        JVar7.u.int32 = uVar4;
        iVar6 = 0;
      }
      JVar2.tag = iVar6;
      JVar2.u.ptr = JVar7.u.ptr;
      JVar1.tag = iVar6;
      JVar1.u.ptr = JVar7.u.ptr;
      JVar7.tag = iVar6;
      JVar7.u.ptr = JVar7.u.ptr;
      if ((0xfffffff4 < uVar5) &&
         (iVar3 = *local_28.ptr, *(int *)local_28.ptr = iVar3 + -1, JVar7 = JVar1, iVar3 < 2)) {
        v_00.tag = v.tag;
        v_00.u.ptr = local_28.ptr;
        __JS_FreeValueRT(ctx->rt,v_00);
        JVar7 = JVar2;
      }
    }
    else {
      if ((0xfffffff4 < uVar5) &&
         (iVar3 = *local_28.ptr, *(int *)local_28.ptr = iVar3 + -1, iVar3 < 2)) {
        v.u.ptr = local_28.ptr;
        __JS_FreeValueRT(ctx->rt,v);
      }
      JVar7 = (JSValue)(ZEXT816(6) << 0x40);
    }
  }
  return JVar7;
}

Assistant:

static JSValue js_string_codePointAt(JSContext *ctx, JSValueConst this_val,
                                     int argc, JSValueConst *argv)
{
    JSValue val, ret;
    JSString *p;
    int idx, c;

    val = JS_ToStringCheckObject(ctx, this_val);
    if (JS_IsException(val))
        return val;
    p = JS_VALUE_GET_STRING(val);
    if (JS_ToInt32Sat(ctx, &idx, argv[0])) {
        JS_FreeValue(ctx, val);
        return JS_EXCEPTION;
    }
    if (idx < 0 || idx >= p->len) {
        ret = JS_UNDEFINED;
    } else {
        c = string_getc(p, &idx);
        ret = JS_NewInt32(ctx, c);
    }
    JS_FreeValue(ctx, val);
    return ret;
}